

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void __thiscall Helper::GenerateRandomPermutations(Helper *this,int n_p,int n_d,int count)

{
  int iVar1;
  uint uVar2;
  time_t tVar3;
  pointer piVar4;
  pointer piVar5;
  int i;
  uint uVar6;
  uint uVar7;
  ostream local_8f0 [8];
  ofstream output_file_pb;
  ostream local_6f0 [8];
  ofstream output_file_db;
  value_type local_4f0 [2];
  ofstream output_file_pa;
  allocator_type local_2f0 [8];
  ofstream output_file_da;
  undefined1 local_f0 [16];
  time_t local_e0;
  time_t t;
  char *local_d0;
  allocator_type *local_c8;
  char *local_c0;
  ostream *local_b8;
  char *local_b0;
  ostream *local_a8;
  char *local_a0;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> pi_p;
  vector<int,_std::allocator<int>_> flags_p;
  vector<int,_std::allocator<int>_> flags_d;
  vector<int,_std::allocator<int>_> pi_d;
  
  local_4f0[0] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_98,(long)n_p,local_4f0,local_2f0);
  local_4f0[0] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(long)n_p,local_4f0,local_2f0);
  local_4f0[0] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(long)n_d,local_4f0,local_2f0);
  local_4f0[0] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(long)n_d,local_4f0,local_2f0);
  std::ofstream::ofstream(local_4f0,"../randoms/alice/Permutations_PA.txt",_S_out);
  std::ofstream::ofstream(local_2f0,"../randoms/alice/Permutations_DA.txt",_S_out);
  std::ofstream::ofstream(local_8f0,"../randoms/bob/Permutations_PB.txt",_S_out);
  std::ofstream::ofstream(local_6f0,"../randoms/bob/Permutations_DB.txt",_S_out);
  tVar3 = time(&local_e0);
  srand((uint)tVar3);
  uVar6 = count * 2;
  uVar2 = 0;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  for (; uVar2 != uVar6; uVar2 = uVar2 + 1) {
    uVar7 = 0;
    while ((int)uVar7 < n_p) {
      iVar1 = rand();
      iVar1 = iVar1 % n_p;
      if (pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage[iVar1] == 0) {
        pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage[iVar1] = 1;
        *(int *)((long)local_98 + (ulong)uVar7 * 4) = iVar1;
        uVar7 = uVar7 + 1;
      }
    }
    uVar7 = 0;
    while ((int)uVar7 < n_d) {
      iVar1 = rand();
      iVar1 = iVar1 % n_d;
      if (flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage[iVar1] == 0) {
        flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage[iVar1] = 1;
        flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage[uVar7] = iVar1;
        uVar7 = uVar7 + 1;
      }
    }
    if ((uVar2 & 1) == 0) {
      t = (time_t)local_4f0;
      local_d0 = " ";
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_f0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_98,
                 (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                 pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start);
      local_c8 = local_2f0;
      local_c0 = " ";
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_f0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                 pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start);
      std::endl<char,std::char_traits<char>>((ostream *)local_4f0);
      std::endl<char,std::char_traits<char>>((ostream *)local_2f0);
      std::ostream::flush();
    }
    else {
      local_b8 = local_8f0;
      local_b0 = " ";
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_f0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_98,
                 (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                 pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start);
      local_a8 = local_6f0;
      local_a0 = " ";
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_f0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                 pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start);
      std::endl<char,std::char_traits<char>>(local_8f0);
      std::endl<char,std::char_traits<char>>(local_6f0);
      std::ostream::flush();
    }
    std::ostream::flush();
    for (piVar4 = pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage;
        piVar5 = flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
        piVar4 != flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar4 = piVar4 + 1) {
      *piVar4 = 0;
    }
    for (; piVar5 != flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar5 = piVar5 + 1) {
      *piVar5 = 0;
    }
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(local_6f0);
  std::ofstream::~ofstream(local_8f0);
  std::ofstream::~ofstream(local_2f0);
  std::ofstream::~ofstream(local_4f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_98);
  return;
}

Assistant:

void Helper::GenerateRandomPermutations(int n_p, int n_d, int count)
{
    std::vector<int> pi_p(n_p, 0), flags_p(n_p, 0);
    std::vector<int> pi_d(n_d, 0), flags_d(n_d, 0);
    std::ofstream output_file_pa("../randoms/alice/Permutations_PA.txt");
    std::ostream_iterator<int> output_iterator_pa(output_file_pa, " ");
    std::ofstream output_file_da("../randoms/alice/Permutations_DA.txt");
    std::ostream_iterator<int> output_iterator_da(output_file_da, " ");
    std::ofstream output_file_pb("../randoms/bob/Permutations_PB.txt");
    std::ostream_iterator<int> output_iterator_pb(output_file_pb, " ");
    std::ofstream output_file_db("../randoms/bob/Permutations_DB.txt");
    std::ostream_iterator<int> output_iterator_db(output_file_db, " ");
    time_t t;
    srand((unsigned)time(&t));

    for (int j = 0; j < 2 * count; j++)
    {
        for (int i = 0, r = 0; i < n_p;)
        {
            r = rand() % n_p;
            if (flags_p[r] == 0)
            {
                flags_p[r] = 1;
                pi_p[i] = r;
                // std::cout << r << " ";
                i++;
            }
        }
        // std::cout << "\n";
        for (int i = 0, r = 0; i < n_d;)
        {
            r = rand() % n_d;
            if (flags_d[r] == 0)
            {
                flags_d[r] = 1;
                pi_d[i] = r;
                // std::cout << r << " ";
                i++;
            }
        }
        // std::cout << "\n";
        if (j % 2 == 0)
        {
            std::copy(pi_p.begin(), pi_p.end(), output_iterator_pa);
            std::copy(pi_d.begin(), pi_d.end(), output_iterator_da);
            output_file_pa << std::endl;
            output_file_da << std::endl;
            output_file_pa.flush();
            output_file_da.flush();
        }
        else
        {
            std::copy(pi_p.begin(), pi_p.end(), output_iterator_pb);
            std::copy(pi_d.begin(), pi_d.end(), output_iterator_db);
            output_file_pb << std::endl;
            output_file_db << std::endl;
            output_file_pb.flush();
            output_file_db.flush();
        }
        std::fill(flags_p.begin(), flags_p.end(), 0);
        std::fill(flags_d.begin(), flags_d.end(), 0);
    }
    output_file_pa.close();
    output_file_da.close();
    output_file_pb.close();
    output_file_db.close();
}